

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O3

void OPENSSL_sk_sort(OPENSSL_STACK *sk,OPENSSL_sk_call_cmp_func call_cmp_func)

{
  void **ppvVar1;
  void *pvVar2;
  ulong i;
  ulong num;
  
  if (((sk != (OPENSSL_STACK *)0x0) && (sk->comp != (OPENSSL_sk_cmp_func)0x0)) && (sk->sorted == 0))
  {
    num = sk->num;
    if (1 < num) {
      for (i = num - 2 >> 1; i < num; i = i - 1) {
        down_heap(sk,call_cmp_func,i,num);
        num = sk->num;
      }
      while (num = num - 1, num != 0) {
        ppvVar1 = sk->data;
        pvVar2 = *ppvVar1;
        *ppvVar1 = ppvVar1[num];
        sk->data[num] = pvVar2;
        down_heap(sk,call_cmp_func,0,num);
      }
    }
    sk->sorted = 1;
  }
  return;
}

Assistant:

void OPENSSL_sk_sort(OPENSSL_STACK *sk,
                     OPENSSL_sk_call_cmp_func call_cmp_func) {
  if (sk == NULL || sk->comp == NULL || sk->sorted) {
    return;
  }

  if (sk->num >= 2) {
    // |qsort| lacks a context parameter in the comparison function for us to
    // pass in |call_cmp_func| and |sk->comp|. While we could cast |sk->comp| to
    // the expected type, it is undefined behavior in C can trip sanitizers.
    // |qsort_r| and |qsort_s| avoid this, but using them is impractical. See
    // https://stackoverflow.com/a/39561369
    //
    // Use our own heap sort instead. This is not performance-sensitive, so we
    // optimize for simplicity and size. First, build a max-heap in place.
    for (size_t i = parent_idx(sk->num - 1); i < sk->num; i--) {
      down_heap(sk, call_cmp_func, i, sk->num);
    }

    // Iteratively remove the maximum element to populate the result in reverse.
    for (size_t i = sk->num - 1; i > 0; i--) {
      void *tmp = sk->data[0];
      sk->data[0] = sk->data[i];
      sk->data[i] = tmp;
      down_heap(sk, call_cmp_func, 0, i);
    }
  }
  sk->sorted = 1;
}